

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnWriteVer.c
# Opt level: O0

void Wln_WriteTables(FILE *pFile,Wln_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  word *pTable_00;
  int iFanin;
  int iNode;
  int iObj;
  int i;
  word *pTable;
  Vec_Int_t *vNodes;
  Wln_Ntk_t *p_local;
  FILE *pFile_local;
  
  if ((p->vTables != (Vec_Ptr_t *)0x0) && (iVar1 = Vec_PtrSize(p->vTables), iVar1 != 0)) {
    iVar1 = Vec_PtrSize(p->vTables);
    p_00 = Vec_IntStart(iVar1);
    for (iFanin = 1; iVar1 = Wln_NtkObjNum(p), iFanin < iVar1; iFanin = iFanin + 1) {
      iVar1 = Wln_ObjType(p,iFanin);
      if (iVar1 == 0x4d) {
        iVar1 = Wln_ObjFanin1(p,iFanin);
        Vec_IntWriteEntry(p_00,iVar1,iFanin);
      }
    }
    for (iNode = 0; iVar1 = Vec_PtrSize(p->vTables), iNode < iVar1; iNode = iNode + 1) {
      pTable_00 = (word *)Vec_PtrEntry(p->vTables,iNode);
      iVar1 = Vec_IntEntry(p_00,iNode);
      iVar2 = Wln_ObjFanin0(p,iVar1);
      iVar2 = Wln_ObjRange(p,iVar2);
      iVar1 = Wln_ObjRange(p,iVar1);
      Wln_WriteTableOne(pFile,iVar2,iVar1,pTable_00,iNode);
    }
    Vec_IntFree(p_00);
  }
  return;
}

Assistant:

void Wln_WriteTables( FILE * pFile, Wln_Ntk_t * p )
{
    Vec_Int_t * vNodes;
    word * pTable; 
    int i, iObj;
    if ( p->vTables == NULL || Vec_PtrSize(p->vTables) == 0 )
        return;
    // map tables into their nodes
    vNodes = Vec_IntStart( Vec_PtrSize(p->vTables) );
    Wln_NtkForEachObj( p, iObj )
        if ( Wln_ObjType(p, iObj) == ABC_OPER_TABLE )
            Vec_IntWriteEntry( vNodes, Wln_ObjFanin1(p, iObj), iObj );
    // write tables
    Vec_PtrForEachEntry( word *, p->vTables, pTable, i )
    {
        int iNode  = Vec_IntEntry( vNodes, i );
        int iFanin = Wln_ObjFanin0( p, iNode );
        Wln_WriteTableOne( pFile, Wln_ObjRange(p, iFanin), Wln_ObjRange(p, iNode), pTable, i );
    }
    Vec_IntFree( vNodes );
}